

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_iq2_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t *pgVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  int iVar4;
  uint64_t *grid;
  int *piVar5;
  uint16_t *puVar6;
  ggml_fp16_t gVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  float *pfVar16;
  char *pcVar17;
  int8_t *piVar18;
  ulong uVar19;
  int k_4;
  float *pfVar20;
  byte bVar21;
  byte bVar22;
  ulong uVar23;
  int i_1;
  char *pcVar24;
  int k_1;
  int8_t *piVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  _Bool is_on_grid [2];
  byte abStack_234 [2];
  _Bool is_on_grid_aux [2];
  float *local_220;
  float local_208;
  float *local_1f0;
  void *local_1e8;
  float *local_1e0;
  float *local_1c0;
  int8_t L [16];
  int8_t Laux [16];
  float xval [16];
  float weight [16];
  float waux [16];
  float scales [16];
  
  if ((char)n_per_row == '\0') {
    lVar8 = n_per_row >> 8;
    lVar27 = 0;
    if (0 < lVar8) {
      lVar27 = lVar8;
    }
    lVar9 = 0;
    if (0 < nrow) {
      lVar9 = nrow;
    }
    lVar12 = 0;
    local_1f0 = src;
    local_1e8 = dst;
    while( true ) {
      puVar6 = iq2_data[3].neighbours;
      piVar5 = iq2_data[3].map;
      grid = iq2_data[3].grid;
      if (lVar12 == lVar9) {
        return nrow * lVar8 * 0x52;
      }
      if (iq2_data[3].map == (int *)0x0) break;
      if (iq2_data[3].grid == (uint64_t *)0x0) {
        pcVar24 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar15 = 0x1296;
        goto LAB_0013ce68;
      }
      if (iq2_data[3].neighbours == (uint16_t *)0x0) {
        pcVar24 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar15 = 0x1297;
        goto LAB_0013ce68;
      }
      local_220 = local_1f0;
      local_1e0 = quant_weights;
      for (lVar26 = 0; lVar26 != lVar27; lVar26 = lVar26 + 1) {
        lVar10 = lVar26 * 0x52;
        pgVar1 = (ggml_fp16_t *)((long)local_1e8 + lVar10);
        puVar2 = (undefined8 *)((long)local_1e8 + lVar10 + 0x40);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)local_1e8 + lVar10 + 0x30);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)local_1e8 + lVar10 + 0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined2 *)((long)local_1e8 + lVar10 + 0x50) = 0;
        puVar2 = (undefined8 *)((long)local_1e8 + lVar10 + 0x10);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)local_1e8 + lVar10) = 0;
        ((undefined8 *)((long)local_1e8 + lVar10))[1] = 0;
        fVar32 = 0.0;
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          fVar32 = fVar32 + local_220[lVar10] * local_220[lVar10];
        }
        fVar33 = (fVar32 + fVar32) * 0.00390625;
        fVar32 = 0.0;
        local_1c0 = local_1e0;
        pfVar20 = local_220;
        for (uVar23 = 0; uVar23 != 0x10; uVar23 = uVar23 + 1) {
          if (quant_weights == (float *)0x0) {
            for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
              weight[lVar10] = fVar33 * 0.25 + pfVar20[lVar10] * pfVar20[lVar10];
            }
          }
          else {
            for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
              fVar30 = local_1c0[lVar10];
              fVar29 = pfVar20[lVar10] * pfVar20[lVar10] + fVar33;
              if (fVar29 < 0.0) {
                fVar29 = sqrtf(fVar29);
              }
              else {
                fVar29 = SQRT(fVar29);
              }
              weight[lVar10] = fVar30 * fVar29;
            }
          }
          for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            fVar30 = weight[lVar10];
            if (fVar30 < 0.0) {
              fVar30 = sqrtf(fVar30);
            }
            else {
              fVar30 = SQRT(fVar30);
            }
            waux[lVar10] = fVar30;
          }
          pfVar11 = xval;
          pfVar16 = pfVar20;
          for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
            bVar22 = 0;
            for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
              fVar30 = pfVar16[lVar13];
              bVar21 = (byte)(1 << ((byte)lVar13 & 0x1f));
              fVar29 = -fVar30;
              if (-fVar30 <= fVar30) {
                bVar21 = 0;
                fVar29 = fVar30;
              }
              bVar22 = bVar21 | bVar22;
              pfVar11[lVar13] = fVar29;
            }
            abStack_234[lVar10] = bVar22;
            pfVar16 = pfVar16 + 8;
            pfVar11 = pfVar11 + 8;
          }
          fVar30 = xval[0];
          for (lVar10 = 1; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            if (fVar30 <= xval[lVar10]) {
              fVar30 = xval[lVar10];
            }
          }
          if (1e-08 <= fVar30) {
            local_208 = fVar30 / 5.0;
            is_on_grid[0] = true;
            is_on_grid[1] = true;
            fVar29 = 0.0;
            for (iVar15 = -9; iVar15 != 10; iVar15 = iVar15 + 1) {
              fVar34 = ((float)iVar15 * 0.1 + 5.0) / fVar30;
              pfVar11 = xval;
              pcVar24 = Laux;
              for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
                  uVar14 = (uint)((pfVar11[lVar13] * fVar34 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                  if (0x400001 < uVar14) {
                    uVar14 = 0x400002;
                  }
                  if (uVar14 < 0x400001) {
                    uVar14 = 0;
                  }
                  pcVar24[lVar13] = (char)uVar14;
                }
                uVar19 = 0;
                pcVar17 = pcVar24;
                for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 2) {
                  uVar19 = (ulong)((uint)uVar19 | (int)*pcVar17 << ((byte)lVar13 & 0x1f));
                  pcVar17 = pcVar17 + 1;
                }
                iVar4 = piVar5[uVar19 & 0xffff];
                is_on_grid_aux[lVar10] = true;
                if ((long)iVar4 < 0) {
                  is_on_grid_aux[lVar10] = false;
                  iq2_find_best_neighbour
                            (puVar6 + (-1 - (long)iVar4),grid,xval + lVar10 * 8,waux + lVar10 * 8,
                             1.0 / fVar34,Laux + lVar10 * 8);
                }
                pcVar24 = pcVar24 + 8;
                pfVar11 = pfVar11 + 8;
              }
              fVar34 = 0.0;
              fVar31 = 0.0;
              for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                fVar35 = (float)(Laux[lVar10] * 2 + 1);
                fVar34 = fVar34 + fVar35 * fVar35 * weight[lVar10];
                fVar31 = fVar31 + fVar35 * xval[lVar10] * weight[lVar10];
              }
              if ((0.0 < fVar34) && (fVar29 * fVar34 < fVar31 * fVar31)) {
                for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                  L[lVar10] = Laux[lVar10];
                }
                for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                  is_on_grid[lVar10] = is_on_grid_aux[lVar10];
                }
                local_208 = fVar31 / fVar34;
                fVar29 = fVar31 * local_208;
              }
            }
            iVar15 = 0;
            for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
              iVar15 = iVar15 + (is_on_grid[lVar10] ^ 1);
            }
            if ((iVar15 != 0) && (0.0 < local_208)) {
              pfVar11 = xval;
              piVar25 = L;
              for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                if (is_on_grid[lVar10] == false) {
                  uVar19 = 0;
                  piVar18 = piVar25;
                  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 2) {
                    uVar14 = (uint)((*(float *)((long)pfVar11 + lVar13 * 2) * (1.0 / local_208) +
                                    -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    if (0x400001 < uVar14) {
                      uVar14 = 0x400002;
                    }
                    if (uVar14 < 0x400001) {
                      uVar14 = 0x400000;
                    }
                    uVar19 = (ulong)((uint)uVar19 | uVar14 << ((byte)lVar13 & 0x1f));
                    *piVar18 = (int8_t)uVar14;
                    piVar18 = piVar18 + 1;
                  }
                  if ((long)piVar5[uVar19 & 0xffff] < 0) {
                    iq2_find_best_neighbour
                              (puVar6 + (-1 - (long)piVar5[uVar19 & 0xffff]),grid,xval + lVar10 * 8,
                               waux + lVar10 * 8,local_208,L + lVar10 * 8);
                  }
                }
                piVar25 = piVar25 + 8;
                pfVar11 = pfVar11 + 8;
              }
              fVar30 = 0.0;
              fVar29 = 0.0;
              for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                fVar34 = (float)(L[lVar10] * 2 + 1);
                fVar30 = fVar30 + fVar34 * xval[lVar10] * weight[lVar10];
                fVar29 = fVar29 + fVar34 * fVar34 * weight[lVar10];
              }
              local_208 = (float)(~-(uint)(0.0 < fVar29) & (uint)local_208 |
                                 (uint)(fVar30 / fVar29) & -(uint)(0.0 < fVar29));
            }
            if (local_208 < 0.0) {
              for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                abStack_234[lVar10] = ~abStack_234[lVar10];
              }
              local_208 = -local_208;
            }
            pcVar24 = L;
            for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
              uVar14 = 0;
              pcVar17 = pcVar24;
              for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 2) {
                uVar14 = uVar14 | (int)*pcVar17 << ((byte)lVar13 & 0x1f);
                pcVar17 = pcVar17 + 1;
              }
              uVar14 = piVar5[uVar14 & 0xffff];
              if ((int)uVar14 < 0) {
                printf("Oops: found point %u not on grid:");
                lVar27 = 8;
                while (bVar28 = lVar27 != 0, lVar27 = lVar27 + -1, bVar28) {
                  printf(" %d",(ulong)(uint)(int)*pcVar24);
                  pcVar24 = pcVar24 + 1;
                }
                putchar(10);
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
                           ,0x1319,"fatal error");
              }
              lVar13 = lVar10 + uVar23 * 2;
              *(char *)((long)pgVar1 + lVar13 + 2) = (char)uVar14;
              pbVar3 = (byte *)((long)pgVar1 + (uVar23 >> 1 & 0x7fffffff) + 0x42);
              *pbVar3 = *pbVar3 | (byte)((uVar14 >> 8) << ((char)lVar13 * '\x02' & 6U));
              *(byte *)((long)pgVar1 + lVar13 + 0x22) = abStack_234[lVar10];
              pcVar24 = pcVar24 + 8;
            }
            if (local_208 < 0.0) {
              pcVar24 = "scale >= 0";
              iVar15 = 0x1320;
              goto LAB_0013ce68;
            }
            scales[uVar23] = local_208;
            if (fVar32 <= local_208) {
              fVar32 = local_208;
            }
          }
          else {
            scales[uVar23] = 0.0;
          }
          pfVar20 = pfVar20 + 0x10;
          local_1c0 = local_1c0 + 0x10;
        }
        if ((fVar32 != 0.0) || (NAN(fVar32))) {
          gVar7 = ggml_compute_fp32_to_fp16((fVar32 / 31.0) * 0.9875);
          *pgVar1 = gVar7;
          for (uVar23 = 0; uVar23 != 0x10; uVar23 = uVar23 + 1) {
            uVar14 = (uint)((scales[uVar23] * (1.0 / (fVar32 / 31.0)) + -1.0) * 0.5 + 12582912.0) &
                     0x7fffff;
            if (0x40000e < uVar14) {
              uVar14 = 0x40000f;
            }
            if (uVar14 < 0x400001) {
              uVar14 = 0;
            }
            uVar19 = uVar23 >> 1 & 0x7fffffff;
            if ((uVar23 & 1) == 0) {
              *(char *)((long)pgVar1 + uVar19 + 0x4a) = (char)uVar14;
            }
            else {
              pbVar3 = (byte *)((long)pgVar1 + uVar19 + 0x4a);
              *pbVar3 = *pbVar3 | (char)uVar14 << 4;
            }
          }
        }
        local_220 = local_220 + 0x100;
        local_1e0 = local_1e0 + 0x100;
      }
      local_1e8 = (void *)((long)local_1e8 + lVar8 * 0x52);
      lVar12 = lVar12 + 1;
      local_1f0 = local_1f0 + n_per_row;
    }
    pcVar24 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
    iVar15 = 0x1295;
  }
  else {
    pcVar24 = "n_per_row%QK_K == 0";
    iVar15 = 0x1336;
  }
LAB_0013ce68:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
             ,iVar15,"GGML_ASSERT(%s) failed",pcVar24);
}

Assistant:

size_t quantize_iq2_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_s_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_s);
    }
    return nrow * nblock * sizeof(block_iq2_s);
}